

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleLineEdit::textAtOffset
          (QString *__return_storage_ptr__,QAccessibleLineEdit *this,int offset,
          TextBoundaryType boundaryType,int *startOffset,int *endOffset)

{
  EchoMode EVar1;
  QLineEdit *this_00;
  
  this_00 = lineEdit(this);
  EVar1 = QLineEdit::echoMode(this_00);
  if (EVar1 == Normal) {
    if (offset == -2) {
      offset = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0xd0))(this);
    }
    QAccessibleTextInterface::textAtOffset
              ((int)__return_storage_ptr__,(int)this + 0x20,(int *)(ulong)(uint)offset,
               (int *)(ulong)boundaryType);
  }
  else {
    *endOffset = -1;
    *startOffset = -1;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleLineEdit::textAtOffset(int offset, QAccessible::TextBoundaryType boundaryType,
        int *startOffset, int *endOffset) const
{
    if (lineEdit()->echoMode() != QLineEdit::Normal) {
        *startOffset = *endOffset = -1;
        return QString();
    }
    if (offset == -2)
        offset = cursorPosition();
    return QAccessibleTextInterface::textAtOffset(offset, boundaryType, startOffset, endOffset);
}